

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

int path(void *userData,char *path,size_t pathLen)

{
  uint uVar1;
  IResultCapture *pIVar2;
  undefined8 uVar3;
  allocator<char> local_32b;
  allocator<char> local_32a;
  allocator<char> local_329;
  string local_328;
  string local_308 [32];
  string local_2e8;
  AssertionInfo __assertionInfo162;
  ExpressionResultBuilder local_258;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"CAPTURE",&local_329);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,&local_32a);
  std::__cxx11::string::string((string *)&local_258,local_308);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xa2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"",&local_32b);
  Catch::AssertionInfo::AssertionInfo
            (&__assertionInfo162,&local_2e8,(SourceLineInfo *)&local_258,&local_328,
             ContinueOnFailure);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  pIVar2 = Catch::getResultCapture();
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::operator<<((ostream *)&local_258.m_stream,"path := ");
  std::operator<<((ostream *)&local_258.m_stream,path);
  uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo162);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar1 & 4) != 0) {
    uVar3 = __cxa_allocate_exception(1);
    __cxa_throw(uVar3,&Catch::TestFailureException::typeinfo,0);
  }
  Catch::AssertionInfo::~AssertionInfo(&__assertionInfo162);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"CAPTURE",&local_329);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,&local_32a);
  std::__cxx11::string::string((string *)&local_258,local_308);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xa3;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"",&local_32b);
  Catch::AssertionInfo::AssertionInfo
            (&__assertionInfo162,&local_2e8,(SourceLineInfo *)&local_258,&local_328,
             ContinueOnFailure);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  pIVar2 = Catch::getResultCapture();
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::operator<<((ostream *)&local_258.m_stream,"pathLen := ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
  uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo162);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar1 & 4) == 0) {
    Catch::AssertionInfo::~AssertionInfo(&__assertionInfo162);
    std::__cxx11::string::assign((char *)((long)userData + 0x98),(ulong)path);
    return 1;
  }
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&Catch::TestFailureException::typeinfo,0);
}

Assistant:

inline int path(void* userData, const char* path, size_t pathLen)
{
    CAPTURE(path);
    CAPTURE(pathLen);
    static_cast<URI*>(userData)->path.assign(path,pathLen);
    return 1;
}